

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void cmp_1(int exp,rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,size_t lsize,size_t rsize,
          rtosc_cmp_options *opt,char *ldesc,char *rdesc,int line)

{
  char *in_RDX;
  char *in_RSI;
  int in_EDI;
  char *in_stack_00000008;
  undefined8 in_stack_00000010;
  int exp_eq;
  char *sgn;
  rtosc_cmp_options *in_stack_00000020;
  int res;
  char *in_stack_ffffffffffffffa8;
  char *testcase;
  int in_stack_ffffffffffffffb0;
  int iVar1;
  char *local_40;
  
  printf("cmp1(%c, %c)\n",(ulong)(uint)(int)*in_RSI,(ulong)(uint)(int)*in_RDX);
  rtosc_arg_vals_cmp(rhs,(rtosc_arg_val_t *)lsize,rsize,(size_t)opt,in_stack_00000020);
  tc_full[0] = '\0';
  strncat(tc_full,in_stack_00000008,0x3ff);
  local_40 = "ERROR";
  if (in_EDI == 0) {
    local_40 = " >(3way)";
  }
  else if (in_EDI == 1) {
    local_40 = " <(3way)";
  }
  else if (in_EDI == 2) {
    local_40 = "==(3way)";
  }
  snprintf(tc_full,0x400,"\"%s\" %s \"%s\"",in_stack_00000008,local_40,in_stack_00000010);
  iVar1 = in_EDI;
  if (in_EDI == 0) {
    assert_int_eq(0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
  }
  else if (in_EDI == 1) {
    assert_int_eq(1,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
  }
  else if (in_EDI == 2) {
    assert_int_eq(2,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0);
  }
  if (in_EDI == 2) {
    testcase = "==(bool)";
  }
  else {
    testcase = "!=(bool)";
  }
  snprintf(tc_full,0x400,"\"%s\" %s \"%s\"",in_stack_00000008,testcase,in_stack_00000010);
  rtosc_arg_vals_eq(rhs,(rtosc_arg_val_t *)lsize,rsize,(size_t)opt,in_stack_00000020);
  assert_int_eq(iVar1,in_stack_ffffffffffffffb0,testcase,0);
  return;
}

Assistant:

void cmp_1(int exp,
           rtosc_arg_val_t* lhs, rtosc_arg_val_t* rhs,
           size_t lsize, size_t rsize,
           const rtosc_cmp_options* opt,
           const char* ldesc, const char* rdesc, int line)
{
    printf("cmp1(%c, %c)\n", lhs->type, rhs->type);
    int res = rtosc_arg_vals_cmp(lhs, rhs, lsize, rsize, opt);

    *tc_full = 0;
    strncat(tc_full, ldesc, tc_len-1);
    const char* sgn = "ERROR";
    switch(exp)
    {
        case gt: sgn = " >(3way)"; break;
        case eq: sgn = "==(3way)"; break;
        case lt: sgn = " <(3way)"; break;
    }

    snprintf(tc_full, tc_len, "\"%s\" %s \"%s\"", ldesc, sgn, rdesc);

    switch(exp)
    {
        case gt: assert_int_eq(1, res  > 0, tc_full, line); break;
        case eq: assert_int_eq(1, res == 0, tc_full, line); break;
        case lt: assert_int_eq(1, res  < 0, tc_full, line); break;
    }

    int exp_eq = (exp == eq);

    sgn = exp_eq ? "==(bool)" : "!=(bool)";
    snprintf(tc_full, tc_len, "\"%s\" %s \"%s\"", ldesc, sgn, rdesc);

    res = rtosc_arg_vals_eq(lhs, rhs, lsize, rsize, opt);
    assert_int_eq(exp_eq, res, tc_full, line);
}